

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseUnscopedName(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  ParseState copy;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    bVar5 = ParseUnqualifiedName(state);
    bVar6 = true;
    if (bVar5) goto LAB_0014c4f7;
    iVar1 = (state->parse_state).mangled_idx;
    iVar2 = (state->parse_state).out_cur_idx;
    iVar3 = (state->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&(state->parse_state).field_0xc;
    bVar5 = ParseTwoCharToken(state,"St");
    if (bVar5) {
      MaybeAppend(state,"std::");
      bVar5 = ParseUnqualifiedName(state);
      bVar6 = true;
      if (bVar5) goto LAB_0014c4f7;
    }
    (state->parse_state).mangled_idx = iVar1;
    (state->parse_state).out_cur_idx = iVar2;
    (state->parse_state).prev_name_idx = iVar3;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar4;
  }
  bVar6 = false;
LAB_0014c4f7:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar6;
}

Assistant:

static bool ParseUnscopedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseUnqualifiedName(state)) {
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "St") && MaybeAppend(state, "std::") &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}